

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.c
# Opt level: O1

int crypto_verify_32(uchar *x,uchar *y)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined4 uVar4;
  undefined1 auVar3 [16];
  
  auVar1 = *(undefined1 (*) [16])(y + 0x10) ^ *(undefined1 (*) [16])(x + 0x10) |
           *(undefined1 (*) [16])y ^ *(undefined1 (*) [16])x;
  auVar3._0_8_ = auVar1._8_8_;
  auVar3._8_4_ = auVar1._8_4_;
  auVar3._12_4_ = auVar1._12_4_;
  uVar4 = SUB164(auVar3 | auVar1,4);
  auVar2._4_4_ = uVar4;
  auVar2._0_4_ = uVar4;
  auVar2._8_4_ = uVar4;
  auVar2._12_4_ = uVar4;
  auVar2 = auVar2 | auVar3 | auVar1;
  auVar1._0_4_ = auVar2._0_4_ >> 0x10;
  auVar1._4_4_ = 0;
  auVar1._8_4_ = auVar2._8_4_ >> 0x10;
  auVar1._12_4_ = auVar2._12_4_ >> 0x10;
  return ((((uint)(ushort)(SUB162(auVar1 | auVar2,0) >> 8) | SUB164(auVar1 | auVar2,0) & 0xff) - 1
           >> 8 & 1) != 0) - 1;
}

Assistant:

int crypto_verify_32(const unsigned char *x,const unsigned char *y)
{
  unsigned int differentbits = 0;
#define F(i) differentbits |= x[i] ^ y[i];
  F(0)
  F(1)
  F(2)
  F(3)
  F(4)
  F(5)
  F(6)
  F(7)
  F(8)
  F(9)
  F(10)
  F(11)
  F(12)
  F(13)
  F(14)
  F(15)
  F(16)
  F(17)
  F(18)
  F(19)
  F(20)
  F(21)
  F(22)
  F(23)
  F(24)
  F(25)
  F(26)
  F(27)
  F(28)
  F(29)
  F(30)
  F(31)
  return (1 & ((differentbits - 1) >> 8)) - 1;
}